

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

uint64_t Imf_3_2::IDManifest::MurmurHash64(string *idString)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  pcVar1 = (idString->_M_dataplus)._M_p;
  uVar2 = (uint)idString->_M_string_length;
  uVar3 = uVar2 + 0xf;
  if (-1 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if ((int)uVar2 < 0x10) {
    uVar7 = 0;
    uVar5 = 0;
  }
  else {
    lVar8 = 0;
    uVar5 = 0;
    uVar7 = 0;
    do {
      uVar5 = ((ulong)(*(long *)(pcVar1 + lVar8) * -0x783c846eeebdac2b) >> 0x21 |
              *(long *)(pcVar1 + lVar8) * -0x775ed61580000000) * 0x4cf5ad432745937f ^ uVar5;
      lVar6 = (uVar5 << 0x1b | uVar5 >> 0x25) + uVar7;
      uVar5 = lVar6 * 5 + 0x52dce729;
      uVar7 = ((ulong)(*(long *)(pcVar1 + lVar8 + 8) * 0x4cf5ad432745937f) >> 0x1f |
              *(long *)(pcVar1 + lVar8 + 8) * 0x4e8b26fe00000000) * -0x783c846eeebdac2b ^ uVar7;
      uVar7 = (lVar6 * 5 + (uVar7 << 0x1f | uVar7 >> 0x21) + 0x52dce729) * 5 + 0x38495ab5;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uint)((int)uVar3 >> 4) << 4 != lVar8);
  }
  lVar8 = (long)((int)uVar3 >> 4) * 0x10;
  uVar4 = 0;
  switch(uVar2 & 0xf) {
  case 0xf:
    uVar4 = (ulong)(byte)pcVar1[lVar8 + 0xe] << 0x30;
  case 0xe:
    uVar4 = uVar4 | (ulong)(byte)pcVar1[lVar8 + 0xd] << 0x28;
  case 0xd:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 0xc] << 0x20;
  case 0xc:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 0xb] << 0x18;
  case 0xb:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 10] << 0x10;
  case 10:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 9] << 8;
  case 9:
    uVar7 = uVar7 ^ (((byte)pcVar1[lVar8 + 8] ^ uVar4) * 0x4cf5ad432745937f >> 0x1f |
                    ((byte)pcVar1[lVar8 + 8] ^ uVar4) * 0x4e8b26fe00000000) * -0x783c846eeebdac2b;
  case 8:
    uVar4 = (ulong)(byte)pcVar1[lVar8 + 7] << 0x38;
  case 7:
    uVar4 = uVar4 | (ulong)(byte)pcVar1[lVar8 + 6] << 0x30;
  case 6:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 5] << 0x28;
  case 5:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 4] << 0x20;
  case 4:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 3] << 0x18;
  case 3:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 2] << 0x10;
  case 2:
    uVar4 = uVar4 ^ (ulong)(byte)pcVar1[lVar8 + 1] << 8;
  case 1:
    uVar5 = uVar5 ^ (((byte)pcVar1[lVar8] ^ uVar4) * -0x783c846eeebdac2b >> 0x21 |
                    ((byte)pcVar1[lVar8] ^ uVar4) * -0x775ed61580000000) * 0x4cf5ad432745937f;
  case 0:
    uVar7 = uVar7 ^ (long)(int)uVar2;
    uVar5 = (uVar5 ^ (long)(int)uVar2) + uVar7;
    uVar7 = uVar7 + uVar5;
    uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0xae502812aa7333;
    uVar4 = (uVar5 >> 0x21 ^ uVar5) * -0x3b314601e57a13ad;
    uVar5 = (uVar7 >> 0x21 ^ uVar7) * -0xae502812aa7333;
    uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3b314601e57a13ad;
    return (uVar5 >> 0x21 ^ uVar5) + (uVar4 >> 0x21 ^ uVar4);
  }
}

Assistant:

uint64_t
IDManifest::MurmurHash64 (const std::string& idString)
{

    uint64_t out[2];
    MurmurHash3_x64_128 (idString.c_str (), idString.size (), 0, out);
    return out[0];
}